

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::
DoSimdLoadExtend<wabt::interp::Simd<int,(unsigned_char)4>,wabt::interp::Simd<short,(unsigned_char)4>>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  undefined1 auVar1 [12];
  RunResult RVar2;
  RunResult RVar3;
  undefined1 auVar4 [16];
  Value value;
  Simd<short,_(unsigned_char)__x04_> local_10;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  RVar2 = Load<wabt::interp::Simd<short,(unsigned_char)4>>(this,instr,&local_10,out_trap);
  RVar3 = Trap;
  if (RVar2 == Ok) {
    auVar6._8_4_ = 0;
    auVar6._0_2_ = local_10.v[0];
    auVar6._2_2_ = local_10.v[1];
    auVar6._4_2_ = local_10.v[2];
    auVar6._6_2_ = local_10.v[3];
    auVar6._12_2_ = local_10.v[3];
    auVar6._14_2_ = local_10.v[3];
    auVar5._12_4_ = auVar6._12_4_;
    auVar5._8_2_ = 0;
    auVar5._0_2_ = local_10.v[0];
    auVar5._2_2_ = local_10.v[1];
    auVar5._4_2_ = local_10.v[2];
    auVar5._6_2_ = local_10.v[3];
    auVar5._10_2_ = local_10.v[2];
    auVar4._10_6_ = auVar5._10_6_;
    auVar4._8_2_ = local_10.v[2];
    auVar4._0_2_ = local_10.v[0];
    auVar4._2_2_ = local_10.v[1];
    auVar4._4_2_ = local_10.v[2];
    auVar4._6_2_ = local_10.v[3];
    auVar1._4_8_ = auVar4._8_8_;
    auVar1._2_2_ = local_10.v[1];
    auVar1._0_2_ = local_10.v[1];
    value.i64_._4_4_ = auVar1._0_4_ >> 0x10;
    value.i32_ = (int)local_10.v[0];
    value._12_4_ = auVar5._12_4_ >> 0x10;
    value._8_4_ = auVar4._8_4_ >> 0x10;
    Push(this,value);
    RVar3 = Ok;
  }
  return RVar3;
}

Assistant:

RunResult Thread::DoSimdLoadExtend(Instr instr, Trap::Ptr* out_trap) {
  T val;
  if (Load<T>(instr, &val, out_trap) != RunResult::Ok) {
    return RunResult::Trap;
  }
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result.v[i] = val.v[i];
  }
  Push(result);
  return RunResult::Ok;
}